

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_stub.c
# Opt level: O2

int ld_supp(supplier_t *sp,int mode)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ld_supp::count + 1;
  bVar2 = ld_supp::count == 0;
  ld_supp::count = iVar1;
  if (bVar2) {
    printf("%s %s\n","No load routine has been defined","for the supplier table\n");
  }
  return 0;
}

Assistant:

int 
ld_supp (supplier_t *sp, int mode)
{
    static int count = 0;

    UNUSED(sp);
    UNUSED(mode);
    if (! count++)
        printf("%s %s\n",
            "No load routine has been defined",
            "for the supplier table\n");

    return(0);
}